

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void CommandLine_Define(KonohaContext *kctx,char *keyvalue,KTraceInfo *trace)

{
  _func_ksymbol_t_KonohaContext_ptr_char_ptr_size_t_int_ksymbol_t *p_Var1;
  _func_kbool_t_KonohaContext_ptr_kNameSpace_ptr_ksymbol_t_ktypeattr_t_uintptr_t_KTraceInfo_ptr
  *p_Var2;
  KClass *pKVar3;
  _func_kObject_ptr_KonohaContext_ptr_KClass_ptr *p_Var4;
  long lVar5;
  KTraceInfo *pKVar6;
  ksymbol_t kVar7;
  char *pcVar8;
  ushort **ppuVar9;
  kNameSpace *pkVar10;
  ktypeattr_t kVar11;
  char *__dest;
  size_t __n;
  undefined8 uStack_50;
  char acStack_48 [8];
  KTraceInfo *local_40;
  char *local_38;
  
  uStack_50 = 0x104095;
  pcVar8 = strchr(keyvalue,0x3d);
  if (pcVar8 != (char *)0x0) {
    __n = (long)pcVar8 - (long)keyvalue;
    lVar5 = -(__n + 0x10 & 0xfffffffffffffff0);
    __dest = acStack_48 + lVar5;
    local_40 = trace;
    local_38 = pcVar8;
    *(undefined8 *)((long)&uStack_50 + lVar5) = 0x1040ce;
    memcpy(__dest,keyvalue,__n);
    __dest[__n] = '\0';
    kVar11 = 0;
    p_Var1 = kctx->klib->Ksymbol;
    *(undefined8 *)((long)&uStack_50 + lVar5) = 0x1040f1;
    kVar7 = (*p_Var1)(kctx,__dest,__n,0,0xfffffffe);
    *(undefined8 *)((long)&uStack_50 + lVar5) = 0x1040f9;
    ppuVar9 = __ctype_b_loc();
    pcVar8 = pcVar8 + 1;
    if ((*(byte *)((long)*ppuVar9 + (long)local_38[1] * 2 + 1) & 8) != 0) {
      *(undefined8 *)((long)&uStack_50 + lVar5) = 0x10411b;
      pcVar8 = (char *)strtol(pcVar8,(char **)0x0,0);
      kVar11 = 4;
    }
    p_Var2 = kctx->klib->kNameSpace_SetConstData;
    pKVar3 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
    p_Var4 = kctx->klib->Knull;
    *(undefined8 *)((long)&uStack_50 + lVar5) = 0x104144;
    pkVar10 = (kNameSpace *)(*p_Var4)(kctx,pKVar3);
    pKVar6 = local_40;
    *(undefined8 *)((long)&uStack_50 + lVar5) = 0x10415a;
    (*p_Var2)(kctx,pkVar10,kVar7,kVar11,(uintptr_t)pcVar8,pKVar6);
    return;
  }
  uStack_50 = 0x104189;
  fwrite("invalid define option: use -D<key>=<value>\n",0x2b,1,_stdout);
  (*kctx->platApi->exit_i)
            (1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/exec/command/command.c"
             ,0x4e);
  return;
}

Assistant:

static void CommandLine_Define(KonohaContext *kctx, char *keyvalue, KTraceInfo *trace)
{
	char *p = strchr(keyvalue, '=');
	if(p != NULL) {
		size_t len = p-keyvalue;
		char *namebuf = ALLOCA(char, len+1);
		memcpy(namebuf, keyvalue, len); namebuf[len] = 0;
//		DBG_P("name='%s'", namebuf);
		ksymbol_t key = KLIB Ksymbol(kctx, namebuf, len, 0, KSymbol_NewId);
		uintptr_t unboxValue;
		ktypeattr_t ty;
		if(isdigit(p[1])) {
			ty = KType_Int;
			unboxValue = (uintptr_t)strtol(p+1, NULL, 0);
		}
		else {
			ty = VirtualType_Text;
			unboxValue = (uintptr_t)(p+1);
		}
		KLIB kNameSpace_SetConstData(kctx, KNULL(NameSpace), key, ty, unboxValue, trace);
	}
	else {
		fprintf(stdout, "invalid define option: use -D<key>=<value>\n");
		KExit(EXIT_FAILURE);
	}
}